

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_FonRight(Cba_Ntk_t *p,int f)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  int in_EDX;
  
  if (f < 1) {
    __assert_fail("Cba_FonIsReal(f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x180,"int Cba_FonRange(Cba_Ntk_t *, int)");
  }
  if ((p->vFonRange).nSize < 1) {
    uVar3 = 0;
  }
  else {
    Vec_IntFillExtra(&p->vFonRange,f + 1,in_EDX);
    if ((p->vFonRange).nSize <= f) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar3 = (p->vFonRange).pArray[(uint)f];
  }
  if (-1 < (int)uVar3) {
    iVar2 = 0;
    if (1 < uVar3) {
      pVVar1 = p->pDesign->vHash->vObjs;
      uVar3 = uVar3 * 2 & 0xfffffffc;
      if (pVVar1->nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar2 = pVVar1->pArray[(ulong)uVar3 + 1];
    }
    return iVar2;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10c,"int Abc_Lit2Var(int)");
}

Assistant:

static inline int            Cba_FonRight( Cba_Ntk_t * p, int f )            { return Cba_NtkRangeRight(p, Cba_FonRange(p, f));                                            }